

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O1

xml_attribute __thiscall pugi::xml_node::prepend_copy(xml_node *this,xml_attribute *proto)

{
  ulong uVar1;
  xml_node_struct *pxVar2;
  xml_allocator *this_00;
  xml_memory_page *pxVar3;
  xml_attribute xVar4;
  xml_attribute_struct *attr;
  uint uVar5;
  xml_attribute a;
  xml_attribute local_28;
  xml_attribute local_20;
  
  if (proto->_attr != (xml_attribute_struct *)0x0) {
    pxVar2 = this->_root;
    if (pxVar2 == (xml_node_struct *)0x0) {
      uVar5 = 0;
    }
    else {
      uVar5 = (uint)pxVar2->header & 0xf;
    }
    if ((uVar5 == 2) || (uVar5 == 7)) {
      if (pxVar2 == (xml_node_struct *)0x0) {
        __assert_fail("object",
                      "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/pugixml.cpp"
                      ,0x49b,
                      "xml_allocator &pugi::impl::(anonymous namespace)::get_allocator(const Object *) [Object = pugi::xml_node_struct]"
                     );
      }
      this_00 = *(xml_allocator **)((long)pxVar2 - (pxVar2->header >> 8));
      uVar1 = this_00->_busy_size + 0x28;
      if (uVar1 < 0x7fd9) {
        local_20._attr = (xml_attribute_struct *)this_00->_root;
        attr = (xml_attribute_struct *)
               ((long)&((xml_memory_page *)local_20._attr)[1].allocator + this_00->_busy_size);
        this_00->_busy_size = uVar1;
      }
      else {
        attr = (xml_attribute_struct *)
               impl::anon_unknown_0::xml_allocator::allocate_memory_oob
                         (this_00,0x28,(xml_memory_page **)&local_20);
      }
      if (attr == (xml_attribute_struct *)0x0) {
        attr = (xml_attribute_struct *)0x0;
      }
      else {
        attr->prev_attribute_c = (xml_attribute_struct *)0x0;
        attr->next_attribute = (xml_attribute_struct *)0x0;
        attr->name = (char_t *)0x0;
        attr->value = (char_t *)0x0;
        attr->header = ((long)attr - (long)local_20._attr) * 0x100;
      }
      xml_attribute::xml_attribute(&local_20,attr);
      if ((xml_memory_page *)local_20._attr != (xml_memory_page *)0x0) {
        pxVar2 = this->_root;
        pxVar3 = (xml_memory_page *)pxVar2->first_attribute;
        xVar4._attr = local_20._attr;
        if (pxVar3 != (xml_memory_page *)0x0) {
          (local_20._attr)->prev_attribute_c = (xml_attribute_struct *)pxVar3->busy_size;
          xVar4._attr = (xml_attribute_struct *)pxVar3;
        }
        ((xml_memory_page *)xVar4._attr)->busy_size = (size_t)local_20._attr;
        (local_20._attr)->next_attribute = (xml_attribute_struct *)pxVar3;
        pxVar2->first_attribute = local_20._attr;
        impl::anon_unknown_0::node_copy_attribute(local_20._attr,proto->_attr);
        return (xml_attribute)local_20._attr;
      }
    }
  }
  xml_attribute::xml_attribute(&local_28);
  return (xml_attribute)local_28._attr;
}

Assistant:

PUGI_IMPL_FN bool xml_attribute::operator!() const
	{
		return !_attr;
	}